

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O3

InverseKinematicsTreatTargetAsConstraint __thiscall
iDynTree::InverseKinematics::targetResolutionMode(InverseKinematics *this,string *frameName)

{
  iDynTree::reportError
            ("InverseKinematics","",
             "IDYNTREE_USES_IPOPT CMake option need to be set to ON to use InverseKinematics");
  return InverseKinematicsTreatTargetAsConstraintNone;
}

Assistant:

enum InverseKinematicsTreatTargetAsConstraint InverseKinematics::targetResolutionMode(const std::string& frameName)
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        internal::kinematics::TransformMap::iterator transConstr = IK_PIMPL(m_pimpl)->getTargetRefIfItExists(frameName);

        if( transConstr == IK_PIMPL(m_pimpl)->m_targets.end() )
        {
            std::stringstream ss;
            ss << "No target for frame " << frameName << " was added to the InverseKinematics problem.";
            reportError("InverseKinematics","targetResolutionMode",ss.str().c_str());
            return InverseKinematicsTreatTargetAsConstraintNone;
        }

        return IK_PIMPL(m_pimpl)->targetResolutionMode(transConstr);
#else
        missingIpoptErrorReport();
        return InverseKinematicsTreatTargetAsConstraintNone;
#endif
    }